

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_loadat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char cVar1;
  gravity_object_t *pgVar2;
  long lVar3;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  int iVar4;
  gravity_fiber_t *pgVar5;
  char *__dest;
  gravity_value_t gVar6;
  uint32_t local_30dc;
  gravity_value_t s;
  int iStack_30b0;
  char c;
  int j;
  int i;
  uint32_t original_len;
  char *original;
  _Bool is_forward;
  uint32_t substr_len;
  char local_3078 [8];
  char _buffer_2 [4096];
  char local_2068 [8];
  char _buffer_1 [4096];
  char local_1058 [8];
  char _buffer [4096];
  gravity_range_t *range;
  int32_t second_index;
  int32_t first_index;
  gravity_value_t value;
  gravity_string_t *string;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar2 = (args->field_1).p;
  lVar3 = args[1].field_1.n;
  if (args[1].isa == gravity_class_int) {
    range._0_4_ = (uint)lVar3;
    range._4_4_ = (uint)range;
  }
  else {
    if (args[1].isa != gravity_class_range) {
      snprintf(local_1058,0x1000,
               "An integer index or index range is required to access string items.");
      pgVar5 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar5,local_1058);
      _buffer_1._4088_8_ = gravity_class_null;
      gVar6.field_1.n = 0;
      gVar6.isa = gravity_class_null;
      gravity_vm_setslot(vm,gVar6,rindex);
      return false;
    }
    range._4_4_ = (uint)*(undefined8 *)(lVar3 + 0x30);
    range._0_4_ = (uint)*(undefined8 *)(lVar3 + 0x38);
  }
  if ((int)range._4_4_ < 0) {
    range._4_4_ = *(int *)((long)&pgVar2->identifier + 4) + range._4_4_;
  }
  if (((int)range._4_4_ < 0) || (*(uint *)((long)&pgVar2->identifier + 4) <= range._4_4_)) {
    snprintf(local_2068,0x1000,"Out of bounds error: first_index %d beyond bounds 0...%d",
             (ulong)range._4_4_,(ulong)(*(int *)((long)&pgVar2->identifier + 4) - 1));
    pgVar5 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar5,local_2068);
    _buffer_2._4088_8_ = gravity_class_null;
    value_02.field_1.n = 0;
    value_02.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_02,rindex);
    vm_local._7_1_ = false;
  }
  else {
    if ((int)(uint)range < 0) {
      range._0_4_ = *(int *)((long)&pgVar2->identifier + 4) + (uint)range;
    }
    if (((int)(uint)range < 0) || (*(uint *)((long)&pgVar2->identifier + 4) <= (uint)range)) {
      snprintf(local_3078,0x1000,"Out of bounds error: second_index %d beyond bounds 0...%d",
               (ulong)(uint)range,(ulong)(*(int *)((long)&pgVar2->identifier + 4) - 1));
      pgVar5 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar5,local_3078);
      value_01.field_1.n = 0;
      value_01.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_01,rindex);
      vm_local._7_1_ = false;
    }
    else {
      if ((int)range._4_4_ < (int)(uint)range) {
        iVar4 = (uint)range - range._4_4_;
      }
      else {
        iVar4 = range._4_4_ - (uint)range;
      }
      local_30dc = iVar4 + 1;
      if ((int)(uint)range < (int)range._4_4_) {
        __dest = (char *)gravity_calloc(vm,1,(ulong)*(uint *)((long)&pgVar2->identifier + 4));
        if (__dest == (char *)0x0) {
          value_00.field_1.n = 0;
          value_00.isa = gravity_class_null;
          gravity_vm_setslot(vm,value_00,rindex);
          vm_local._7_1_ = false;
        }
        else {
          strncpy(__dest,(char *)pgVar2->objclass,(ulong)*(uint *)((long)&pgVar2->identifier + 4));
          iStack_30b0 = *(int *)((long)&pgVar2->identifier + 4);
          iVar4 = iStack_30b0 - range._4_4_;
          for (s.field_1.n._4_4_ = 0; iStack_30b0 = iStack_30b0 + -1,
              (int)s.field_1.n._4_4_ < iStack_30b0; s.field_1.n._4_4_ = s.field_1.n._4_4_ + 1) {
            cVar1 = __dest[iStack_30b0];
            __dest[iStack_30b0] = __dest[(int)s.field_1.n._4_4_];
            __dest[(int)s.field_1.n._4_4_] = cVar1;
          }
          gVar6 = gravity_string_to_value(vm,__dest + (iVar4 + -1),local_30dc);
          free(__dest);
          gravity_vm_setslot(vm,gVar6,rindex);
          vm_local._7_1_ = true;
        }
      }
      else {
        gVar6 = gravity_string_to_value
                          (vm,(char *)((long)&pgVar2->objclass->isa + (long)(int)range._4_4_),
                           local_30dc);
        gravity_vm_setslot(vm,gVar6,rindex);
        vm_local._7_1_ = true;
      }
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_loadat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_value_t value = GET_VALUE(1);

    int32_t first_index;
    int32_t second_index;

    if (VALUE_ISA_INT(value)) {
        first_index = (int32_t)VALUE_AS_INT(value);
        second_index = first_index;
    }
    else if (VALUE_ISA_RANGE(value)) {
        gravity_range_t *range = VALUE_AS_RANGE(value);
        first_index = (int32_t)range->from;
        second_index = (int32_t)range->to;
    }
    else {
        RETURN_ERROR("An integer index or index range is required to access string items.");
    }

    if (first_index < 0) first_index = string->len + first_index;
    if ((first_index < 0) || ((uint32_t)first_index >= string->len)) RETURN_ERROR("Out of bounds error: first_index %d beyond bounds 0...%d", first_index, string->len-1);

    if (second_index < 0) second_index = string->len + second_index;
    if ((second_index < 0) || ((uint32_t)second_index >= string->len)) RETURN_ERROR("Out of bounds error: second_index %d beyond bounds 0...%d", second_index, string->len-1);

    uint32_t substr_len = first_index < second_index ? second_index - first_index + 1 : first_index - second_index + 1;

    bool is_forward = first_index <= second_index;
    if (!is_forward) {
        char *original = mem_alloc(vm, string->len);
        CHECK_MEM_ALLOC(original);

        // without copying it, we would be modifying the original string
        strncpy((char *)original, string->s, string->len);
        uint32_t original_len = (uint32_t) string->len;

        // Reverse the string, and reverse the indices
        first_index = original_len - first_index -1;

        // reverse the String
        int i = original_len - 1;
        int j = 0;
        char c;
        while (i > j) {
            c = original[i];
            original[i] = original[j];
            original[j] = c;
            --i;
            ++j;
        }

        gravity_value_t s = VALUE_FROM_STRING(vm, original + first_index, substr_len);
        mem_free(original);

        RETURN_VALUE(s, rindex);
    }
    RETURN_VALUE(VALUE_FROM_STRING(vm, string->s + first_index, substr_len), rindex);
}